

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O2

void read_tx_size_vartx(MACROBLOCKD *xd,MB_MODE_INFO *mbmi,TX_SIZE tx_size,int depth,int blk_row,
                       int blk_col,aom_reader *r)

{
  BLOCK_SIZE bsize;
  byte bVar1;
  int iVar2;
  FRAME_CONTEXT *pFVar3;
  uint split_size;
  ulong uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  ulong uVar12;
  int offsetr;
  int col;
  int iVar13;
  TX_SIZE TVar14;
  int iVar15;
  TXFM_CONTEXT *pTVar16;
  TXFM_CONTEXT *pTVar17;
  
  pFVar3 = xd->tile_ctx;
  bsize = mbmi->bsize;
  iVar5 = max_block_high(xd,bsize,0);
  iVar6 = max_block_wide(xd,bsize,0);
  if (iVar5 <= blk_row) {
    return;
  }
  if (iVar6 <= blk_col) {
    return;
  }
  bVar1 = ""[""[bsize]];
  iVar6 = *(int *)((long)tx_size_wide_log2 + (ulong)((uint)bVar1 * 4)) + -2;
  iVar5 = *(int *)((long)tx_size_high_log2 + (ulong)((uint)bVar1 * 4)) + -2;
  iVar15 = (uint)""[bsize] - iVar6;
  bVar11 = tx_size;
  if (depth == 2) {
    set_inter_tx_size(mbmi,iVar15,iVar6,iVar5,(uint)bVar1,(uint)tx_size,(uint)tx_size,blk_row,
                      blk_col);
    mbmi->tx_size = tx_size;
    pTVar17 = xd->above_txfm_context + blk_col;
    pTVar16 = xd->left_txfm_context + blk_row;
    goto LAB_00168058;
  }
  uVar4 = (ulong)tx_size;
  split_size = (uint)tx_size;
  if (tx_size == '\0') {
    lVar8 = 0;
  }
  else {
    bVar9 = block_size_high[bsize];
    if (block_size_high[bsize] < block_size_wide[bsize]) {
      bVar9 = block_size_wide[bsize];
    }
    if (bVar9 == 8) {
      TVar14 = '\x01';
      bVar10 = 0;
LAB_00167e9f:
      uVar12 = (ulong)(byte)(((""[uVar4] != TVar14 & bVar10) + TVar14 * -2) * '\x03' + 0x18);
    }
    else {
      bVar10 = 1;
      if (bVar9 == 0x10) {
        TVar14 = '\x02';
        goto LAB_00167e9f;
      }
      TVar14 = '\x04';
      if ((bVar9 == 0x80) || (bVar9 == 0x40)) goto LAB_00167e9f;
      if (bVar9 == 0x20) {
        TVar14 = '\x03';
        goto LAB_00167e9f;
      }
      uVar12 = 0x3f;
    }
    lVar8 = (ulong)(xd->left_txfm_context[blk_row] <
                   *(byte *)((long)tx_size_high + (ulong)(split_size * 4))) +
            (ulong)(xd->above_txfm_context[blk_col] <
                   *(byte *)((long)tx_size_wide + (ulong)(split_size * 4))) + uVar12;
  }
  iVar7 = aom_read_symbol_(r,pFVar3->txfm_partition_cdf[lVar8],2);
  if (iVar7 == 0) {
    set_inter_tx_size(mbmi,iVar15,iVar6,iVar5,(uint)bVar1,split_size,(uint)tx_size,blk_row,blk_col);
    mbmi->tx_size = tx_size;
    pTVar17 = xd->above_txfm_context;
    pTVar16 = xd->left_txfm_context;
  }
  else {
    bVar11 = ""[uVar4];
    if ((99UL >> (uVar4 & 0x3f) & 1) == 0) {
      iVar5 = tx_size_wide_unit[bVar11];
      iVar6 = tx_size_high_unit[bVar11];
      iVar15 = tx_size_high_unit[uVar4];
      for (iVar7 = 0; iVar7 < iVar15; iVar7 = iVar7 + iVar6) {
        iVar2 = tx_size_wide_unit[uVar4];
        for (iVar13 = 0; iVar13 < iVar2; iVar13 = iVar13 + iVar5) {
          read_tx_size_vartx(xd,mbmi,bVar11,depth + 1,iVar7 + blk_row,blk_col + iVar13,r);
        }
      }
      return;
    }
    set_inter_tx_size(mbmi,iVar15,iVar6,iVar5,(uint)bVar1,split_size,0,blk_row,blk_col);
    mbmi->tx_size = bVar11;
    pTVar17 = xd->above_txfm_context;
    pTVar16 = xd->left_txfm_context;
  }
  pTVar17 = pTVar17 + blk_col;
  pTVar16 = pTVar16 + blk_row;
LAB_00168058:
  txfm_partition_update(pTVar17,pTVar16,bVar11,tx_size);
  return;
}

Assistant:

static inline void read_tx_size_vartx(MACROBLOCKD *xd, MB_MODE_INFO *mbmi,
                                      TX_SIZE tx_size, int depth, int blk_row,
                                      int blk_col, aom_reader *r) {
  FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
  int is_split = 0;
  const BLOCK_SIZE bsize = mbmi->bsize;
  const int max_blocks_high = max_block_high(xd, bsize, 0);
  const int max_blocks_wide = max_block_wide(xd, bsize, 0);
  if (blk_row >= max_blocks_high || blk_col >= max_blocks_wide) return;
  assert(tx_size > TX_4X4);
  TX_SIZE txs = max_txsize_rect_lookup[bsize];
  for (int level = 0; level < MAX_VARTX_DEPTH - 1; ++level)
    txs = sub_tx_size_map[txs];
  const int tx_w_log2 = tx_size_wide_log2[txs] - MI_SIZE_LOG2;
  const int tx_h_log2 = tx_size_high_log2[txs] - MI_SIZE_LOG2;
  const int bw_log2 = mi_size_wide_log2[bsize];
  const int stride_log2 = bw_log2 - tx_w_log2;

  if (depth == MAX_VARTX_DEPTH) {
    set_inter_tx_size(mbmi, stride_log2, tx_w_log2, tx_h_log2, txs, tx_size,
                      tx_size, blk_row, blk_col);
    mbmi->tx_size = tx_size;
    txfm_partition_update(xd->above_txfm_context + blk_col,
                          xd->left_txfm_context + blk_row, tx_size, tx_size);
    return;
  }

  const int ctx = txfm_partition_context(xd->above_txfm_context + blk_col,
                                         xd->left_txfm_context + blk_row,
                                         mbmi->bsize, tx_size);
  is_split = aom_read_symbol(r, ec_ctx->txfm_partition_cdf[ctx], 2, ACCT_STR);

  if (is_split) {
    const TX_SIZE sub_txs = sub_tx_size_map[tx_size];
    const int bsw = tx_size_wide_unit[sub_txs];
    const int bsh = tx_size_high_unit[sub_txs];

    if (sub_txs == TX_4X4) {
      set_inter_tx_size(mbmi, stride_log2, tx_w_log2, tx_h_log2, txs, tx_size,
                        sub_txs, blk_row, blk_col);
      mbmi->tx_size = sub_txs;
      txfm_partition_update(xd->above_txfm_context + blk_col,
                            xd->left_txfm_context + blk_row, sub_txs, tx_size);
      return;
    }

    assert(bsw > 0 && bsh > 0);
    for (int row = 0; row < tx_size_high_unit[tx_size]; row += bsh) {
      for (int col = 0; col < tx_size_wide_unit[tx_size]; col += bsw) {
        int offsetr = blk_row + row;
        int offsetc = blk_col + col;
        read_tx_size_vartx(xd, mbmi, sub_txs, depth + 1, offsetr, offsetc, r);
      }
    }
  } else {
    set_inter_tx_size(mbmi, stride_log2, tx_w_log2, tx_h_log2, txs, tx_size,
                      tx_size, blk_row, blk_col);
    mbmi->tx_size = tx_size;
    txfm_partition_update(xd->above_txfm_context + blk_col,
                          xd->left_txfm_context + blk_row, tx_size, tx_size);
  }
}